

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_assertion_tests.cpp
# Opt level: O2

void __thiscall
test::string_assertion_test::iu_StrCaseTest_x_iutest_x_NeNull_R_Test<wchar_t>::Body
          (iu_StrCaseTest_x_iutest_x_NeNull_R_Test<wchar_t> *this)

{
  AssertionResult iutest_ar;
  AssertionResult local_1e8;
  iuCodeMessage local_1c0;
  Fixed local_190;
  
  iutest::internal::CmpHelperSTRCASENE
            (&local_1e8,"TestFixture::Text::test","__null",(wchar_t *)text<wchar_t>::test,
             (wchar_t *)0x0);
  if (local_1e8.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x9e,local_1e8.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 0xffffffff;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
    std::__cxx11::string::~string((string *)&local_1c0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&local_1e8);
  iutest::internal::CmpHelperSTRCASENE
            (&local_1e8,"TestFixture::Text::test","__null",(wchar_t *)text<wchar_t>::test,
             (wchar_t *)0x0);
  if (local_1e8.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x9f,local_1e8.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
    std::__cxx11::string::~string((string *)&local_1c0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&local_1e8);
  iutest::internal::CmpHelperSTRCASENE
            (&local_1e8,"TestFixture::Text::test","__null",(wchar_t *)text<wchar_t>::test,
             (wchar_t *)0x0);
  if (local_1e8.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0xa0,local_1e8.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
    std::__cxx11::string::~string((string *)&local_1c0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&local_1e8);
  return;
}

Assistant:

IUTEST_TYPED_TEST(StrCaseTest, NeNull_R)
{
    IUTEST_INFORM_STRCASENE(TestFixture::Text::test, NULL);
    IUTEST_EXPECT_STRCASENE(TestFixture::Text::test, NULL);
    IUTEST_ASSERT_STRCASENE(TestFixture::Text::test, NULL);
}